

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void sel_grow_repeat_new_proc(Am_Object *command_obj,Am_Value *new_sel,Am_Value *new_value)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  Am_Object local_88;
  Am_Object parent;
  Am_Value local_70;
  Am_Object local_60;
  Am_Object local_58;
  undefined1 local_50 [8];
  Am_Selective_Repeat_New_Method method;
  undefined1 local_30 [8];
  Am_Value_List l;
  Am_Value *new_value_local;
  Am_Value *new_sel_local;
  Am_Object *command_obj_local;
  
  l.item = (Am_List_Item *)new_value;
  bVar1 = Am_Value_List::Test(new_sel);
  if (bVar1) {
    Am_Value_List::Am_Value_List((Am_Value_List *)local_30,new_sel);
    uVar2 = Am_Value_List::Length((Am_Value_List *)local_30);
    if (uVar2 == 1) {
      Am_Value_List::Start((Am_Value_List *)local_30);
      pAVar3 = Am_Value_List::Get((Am_Value_List *)local_30);
      Am_Value::operator=(new_sel,pAVar3);
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  }
  Am_Object::Get_Object(&local_58,0x988,0xc6);
  pAVar3 = Am_Object::Get(&local_58,0x14a,0);
  Am_Selective_Repeat_New_Method::Am_Selective_Repeat_New_Method
            ((Am_Selective_Repeat_New_Method *)local_50,pAVar3);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Am_Object(&local_60,command_obj);
  Am_Value::Am_Value(&local_70,new_sel);
  Am_Value::Am_Value((Am_Value *)&parent,new_value);
  (*(code *)method.from_wrapper)(&local_60,&local_70,&parent);
  Am_Value::~Am_Value((Am_Value *)&parent);
  Am_Value::~Am_Value(&local_70);
  Am_Object::~Am_Object(&local_60);
  pAVar3 = Am_Object::Get(command_obj,0x154,0);
  Am_Object::Am_Object(&local_88,pAVar3);
  bVar1 = Am_Object::Valid(&local_88);
  if (bVar1) {
    pAVar3 = Am_Object::Get(command_obj,0x16d,0);
    Am_Object::Set(&local_88,0x16d,pAVar3,0);
    pAVar3 = Am_Object::Get(command_obj,0x169,0);
    Am_Object::Set(&local_88,0x169,pAVar3,0);
    pAVar3 = Am_Object::Get(command_obj,0x16c,0);
    Am_Object::Set(&local_88,0x16c,pAVar3,0);
    pAVar3 = Am_Object::Get(&local_88,0x154,0);
    Am_Object::operator=(&local_88,pAVar3);
    bVar1 = Am_Object::Valid(&local_88);
    if (bVar1) {
      pAVar3 = Am_Object::Get(command_obj,0x16d,0);
      Am_Object::Set(&local_88,0x16d,pAVar3,0);
      pAVar3 = Am_Object::Get(command_obj,0x169,0);
      Am_Object::Set(&local_88,0x169,pAVar3,0);
      pAVar3 = Am_Object::Get(command_obj,0x16c,0);
      Am_Object::Set(&local_88,0x16c,pAVar3,0);
    }
  }
  Am_Object::~Am_Object(&local_88);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void, sel_grow_repeat_new,
                 (Am_Object command_obj, Am_Value new_sel, Am_Value new_value))
{
  if (Am_Value_List::Test(new_sel)) {
    Am_Value_List l = new_sel;
    if (l.Length() == 1) {
      l.Start();
      new_sel = l.Get();
    }
  }
  //now call the regular grow again method
  Am_Selective_Repeat_New_Method method =
      Am_Move_Grow_Interactor.Get_Object(Am_IMPLEMENTATION_COMMAND)
          .Get(Am_SELECTIVE_REPEAT_ON_NEW_METHOD);
  method.Call(command_obj, new_sel, new_value);
  Am_Object parent = command_obj.Get(Am_IMPLEMENTATION_PARENT);
  //in selection widget, parent is interactor's main command, and parent's
  //parent is the move-grow command in the widget
  if (parent.Valid()) {
    parent.Set(Am_OBJECT_MODIFIED, command_obj.Get(Am_OBJECT_MODIFIED));
    parent.Set(Am_VALUE, command_obj.Get(Am_VALUE));
    parent.Set(Am_OLD_VALUE, command_obj.Get(Am_OLD_VALUE));
    parent = parent.Get(Am_IMPLEMENTATION_PARENT);
    if (parent.Valid()) {
      parent.Set(Am_OBJECT_MODIFIED, command_obj.Get(Am_OBJECT_MODIFIED));
      parent.Set(Am_VALUE, command_obj.Get(Am_VALUE));
      parent.Set(Am_OLD_VALUE, command_obj.Get(Am_OLD_VALUE));
    }
  }
}